

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayCloseFailureIncludesTolerance::
TestCheckArrayCloseFailureIncludesTolerance(TestCheckArrayCloseFailureIncludesTolerance *this)

{
  char *suiteName;
  TestCheckArrayCloseFailureIncludesTolerance *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckArrayCloseFailureIncludesTolerance",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,0x1ac);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestCheckArrayCloseFailureIncludesTolerance_001832c0;
  return;
}

Assistant:

TEST(CheckArrayCloseFailureIncludesTolerance)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		float const data1[4] = { 0, 1, 2, 3 };
        float const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_CLOSE (data1, data2, 4, 0.01f);
    }

    CHECK(strstr(reporter.lastFailedMessage, "0.01"));
}